

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

array_container_t * array_container_from_run(run_container_t *arr)

{
  int iVar1;
  int iVar2;
  array_container_t *paVar3;
  int *in_RDI;
  int run_value;
  int run_end;
  int run_start;
  int rlepos;
  array_container_t *answer;
  undefined4 in_stack_ffffffffffffffd8;
  int32_t in_stack_ffffffffffffffdc;
  uint local_20;
  int local_14;
  
  run_container_cardinality
            ((run_container_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  paVar3 = array_container_create_given_capacity(in_stack_ffffffffffffffdc);
  paVar3->cardinality = 0;
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    local_20 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_14 * 4);
    iVar2 = local_20 + *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_14 * 4);
    for (; (int)local_20 <= iVar2; local_20 = local_20 + 1) {
      iVar1 = paVar3->cardinality;
      paVar3->cardinality = iVar1 + 1;
      paVar3->array[iVar1] = (uint16_t)local_20;
    }
  }
  return paVar3;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}